

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O0

set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_> *
__thiscall
CsSignal::SignalBase::internal_receiverList
          (set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
           *__return_storage_ptr__,SignalBase *this,BentoAbstract *signalMethod_Bento)

{
  bool bVar1;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *this_00;
  type this_01;
  SlotBase *local_80;
  ConnectStruct *local_78;
  ConnectStruct *item;
  const_iterator cStack_68;
  end_iterator __end1;
  const_iterator __begin1;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *__range1;
  undefined1 local_48 [8];
  read_handle senderListHandle;
  BentoAbstract *signalMethod_Bento_local;
  SignalBase *this_local;
  set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
  *retval;
  
  senderListHandle._31_1_ = 0;
  std::
  set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
  ::set(__return_storage_ptr__);
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::lock_read((read_handle *)local_48,&this->m_connectList);
  this_00 = libguarded::
            rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
            ::read_handle::operator*((read_handle *)local_48);
  cStack_68 = libguarded::
              rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
              ::begin(this_00);
  libguarded::
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  ::end(this_00);
  while (bVar1 = libguarded::
                 rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
                 ::const_iterator::operator!=
                           (&stack0xffffffffffffff98,(end_iterator *)((long)&item + 7)), bVar1) {
    local_78 = libguarded::
               rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
               ::const_iterator::operator*(&stack0xffffffffffffff98);
    this_01 = std::
              unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
              ::operator*(&local_78->signalMethod);
    bVar1 = Internal::BentoAbstract::operator!=(this_01,signalMethod_Bento);
    if (!bVar1) {
      local_80 = local_78->receiver;
      std::
      set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
      ::insert(__return_storage_ptr__,&local_80);
    }
    libguarded::
    rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
    ::const_iterator::operator++(&stack0xffffffffffffff98);
  }
  senderListHandle._31_1_ = 1;
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::read_handle::~read_handle((read_handle *)local_48);
  if ((senderListHandle._31_1_ & 1) == 0) {
    std::
    set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
    ::~set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CsSignal::SlotBase *> CsSignal::SignalBase::internal_receiverList(
                  const Internal::BentoAbstract &signalMethod_Bento) const
{
   std::set<SlotBase *> retval;

   auto senderListHandle = m_connectList.lock_read();

   for (auto &item : *senderListHandle) {

      if (*(item.signalMethod) != signalMethod_Bento)  {
         continue;
      }

      retval.insert(const_cast<SlotBase *>(item.receiver));
   }

   return retval;
}